

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadLogicalExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this,int opcode)

{
  Kind KVar1;
  uint uVar2;
  int iVar3;
  AssertionFailure *this_00;
  char *pcVar4;
  TextReader<fmt::Locale> *pTVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001ca604:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) goto LAB_001ca5a7;
    if (KVar1 == FIRST_BINARY_LOGICAL) goto LAB_001ca59f;
    if (KVar1 == FIRST_RELATIONAL) {
      pTVar5 = this->reader_;
      pcVar4 = (pTVar5->super_ReaderBase).ptr_;
      (pTVar5->super_ReaderBase).token_ = pcVar4;
      (pTVar5->super_ReaderBase).ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      pTVar5 = this->reader_;
      pcVar4 = (pTVar5->super_ReaderBase).ptr_;
      (pTVar5->super_ReaderBase).token_ = pcVar4;
      (pTVar5->super_ReaderBase).ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      return 0;
    }
switchD_001ca443_caseD_3c:
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x2631f2,&local_28
              );
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pTVar5 = this->reader_;
      pcVar4 = (pTVar5->super_ReaderBase).ptr_;
      (pTVar5->super_ReaderBase).token_ = pcVar4;
      (pTVar5->super_ReaderBase).ptr_ = pcVar4 + 1;
      ReadNumericExpr(this,*pcVar4,false);
      pTVar5 = this->reader_;
      pcVar4 = (pTVar5->super_ReaderBase).ptr_;
      (pTVar5->super_ReaderBase).token_ = pcVar4;
      (pTVar5->super_ReaderBase).ptr_ = pcVar4 + 1;
      if (*pcVar4 == 'o') {
        uVar2 = ReadOpCode(this);
        if (0x52 < uVar2) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001ca604;
        }
        if (OpCodeInfo::INFO[uVar2].kind != COUNT) {
          pTVar5 = this->reader_;
          pcVar4 = (pTVar5->super_ReaderBase).token_;
          goto LAB_001ca49a;
        }
      }
      else {
LAB_001ca49a:
        local_38 = 0;
        uStack_30 = 0;
        local_28.types_ = 0;
        local_28.field_1.values_ = (Value *)&local_38;
        TextReader<fmt::Locale>::DoReportError(pTVar5,pcVar4,(CStringRef)0x261792,&local_28);
      }
      ReadCountExpr(this);
      break;
    default:
      goto switchD_001ca443_caseD_3c;
    case IMPLICATION:
      ReadLogicalExpr(this);
LAB_001ca59f:
      ReadLogicalExpr(this);
LAB_001ca5a7:
      ReadLogicalExpr(this);
      break;
    case EXISTS:
      iVar3 = ReadNumArgs(this,3);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar3) {
        do {
          ReadLogicalExpr(this);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      break;
    case ALLDIFF:
      iVar3 = ReadNumArgs(this,1);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar3) {
        do {
          pTVar5 = this->reader_;
          pcVar4 = (pTVar5->super_ReaderBase).ptr_;
          (pTVar5->super_ReaderBase).token_ = pcVar4;
          (pTVar5->super_ReaderBase).ptr_ = pcVar4 + 1;
          ReadNumericExpr(this,*pcVar4,false);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
  }
  return 0;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }